

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_WriteObjectTag(BCWriterState *s,JSValue obj)

{
  JSAtom v;
  uint uVar1;
  long lVar2;
  long lVar3;
  JSAtomKindEnum JVar4;
  int iVar5;
  uint32_t v_00;
  ulong uVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  JSValue obj_00;
  
  dbuf_putc(&s->dbuf,'\b');
  lVar2 = *(long *)((long)obj.u.ptr + 0x18);
  v_00 = 0;
  iVar8 = 0;
  do {
    if (iVar8 == 1) {
      dbuf_put_leb128(&s->dbuf,v_00);
    }
    if (*(int *)(lVar2 + 0x28) != 0) {
      lVar7 = 8;
      uVar6 = 0;
      do {
        v = *(JSAtom *)(lVar2 + 0x44 + uVar6 * 8);
        if (((v != 0) && (JVar4 = JS_AtomGetKind(s->ctx,v), JVar4 == JS_ATOM_KIND_STRING)) &&
           (uVar1 = *(uint *)(lVar2 + 0x40 + uVar6 * 8), (uVar1 >> 0x1c & 1) != 0)) {
          if (0x3fffffff < uVar1) {
            JS_ThrowTypeError(s->ctx,"only value properties are supported");
            return -1;
          }
          if (iVar8 == 0) {
            v_00 = v_00 + 1;
          }
          else {
            bc_put_atom(s,v);
            lVar3 = *(long *)((long)obj.u.ptr + 0x20);
            obj_00.tag = *(int64_t *)(lVar3 + lVar7);
            obj_00.u.ptr = ((JSValueUnion *)(lVar3 + -8 + lVar7))->ptr;
            iVar5 = JS_WriteObjectRec(s,obj_00);
            if (iVar5 != 0) {
              return -1;
            }
          }
        }
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0x10;
      } while (uVar6 < *(uint *)(lVar2 + 0x28));
    }
    bVar9 = iVar8 == 0;
    iVar8 = iVar8 + 1;
  } while (bVar9);
  return 0;
}

Assistant:

static int JS_WriteObjectTag(BCWriterState *s, JSValueConst obj)
{
    JSObject *p = JS_VALUE_GET_OBJ(obj);
    uint32_t i, prop_count;
    JSShape *sh;
    JSShapeProperty *pr;
    int pass;
    JSAtom atom;

    bc_put_u8(s, BC_TAG_OBJECT);
    prop_count = 0;
    sh = p->shape;
    for(pass = 0; pass < 2; pass++) {
        if (pass == 1)
            bc_put_leb128(s, prop_count);
        for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count; i++, pr++) {
            atom = pr->atom;
            if (atom != JS_ATOM_NULL &&
                JS_AtomIsString(s->ctx, atom) &&
                (pr->flags & JS_PROP_ENUMERABLE)) {
                if (pr->flags & JS_PROP_TMASK) {
                    JS_ThrowTypeError(s->ctx, "only value properties are supported");
                    goto fail;
                }
                if (pass == 0) {
                    prop_count++;
                } else {
                    bc_put_atom(s, atom);
                    if (JS_WriteObjectRec(s, p->prop[i].u.value))
                        goto fail;
                }
            }
        }
    }
    return 0;
 fail:
    return -1;
}